

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_checksum.cpp
# Opt level: O3

uint lzham::adler32(void *pBuf,size_t buflen,uint adler32)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  uint8 *buffer;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar12 = (ulong)adler32 & 0xffff;
  uVar2 = (ulong)(adler32 >> 0x10);
  if (buflen != 0) {
    uVar13 = buflen % 0x15b0;
    do {
      uVar3 = 0;
      uVar4 = uVar3;
      if (7 < uVar13) {
        do {
          lVar5 = *(byte *)((long)pBuf + uVar4) + uVar12;
          lVar9 = (ulong)*(byte *)((long)pBuf + uVar4 + 1) + lVar5;
          lVar6 = (ulong)*(byte *)((long)pBuf + uVar4 + 2) + lVar9;
          lVar10 = (ulong)*(byte *)((long)pBuf + uVar4 + 3) + lVar6;
          lVar7 = (ulong)*(byte *)((long)pBuf + uVar4 + 4) + lVar10;
          lVar11 = (ulong)*(byte *)((long)pBuf + uVar4 + 5) + lVar7;
          lVar8 = (ulong)*(byte *)((long)pBuf + uVar4 + 6) + lVar11;
          uVar12 = (ulong)*(byte *)((long)pBuf + uVar4 + 7) + lVar8;
          uVar2 = uVar2 + lVar5 + lVar9 + lVar6 + lVar10 + lVar7 + lVar11 + lVar8 + uVar12;
          uVar3 = uVar4 + 8;
          uVar1 = uVar4 + 0xf;
          uVar4 = uVar3;
        } while (uVar1 < uVar13);
        pBuf = (void *)((long)pBuf + uVar3);
      }
      lVar5 = uVar13 - uVar3;
      if (uVar3 <= uVar13 && lVar5 != 0) {
        lVar6 = 0;
        do {
          uVar12 = uVar12 + *(byte *)((long)pBuf + lVar6);
          uVar2 = uVar2 + uVar12;
          lVar6 = lVar6 + 1;
        } while (lVar5 != lVar6);
        pBuf = (void *)((long)pBuf + lVar5);
      }
      uVar12 = uVar12 % 0xfff1;
      uVar2 = uVar2 % 0xfff1;
      buflen = buflen - uVar13;
      uVar13 = 0x15b0;
    } while (buflen != 0);
  }
  return (int)uVar12 + (int)uVar2 * 0x10000;
}

Assistant:

uint adler32(const void* pBuf, size_t buflen, uint adler32)
   {
      const uint8* buffer = static_cast<const uint8*>(pBuf);
      
      const unsigned long ADLER_MOD = 65521;
      unsigned long s1 = adler32 & 0xffff, s2 = adler32 >> 16;
      size_t blocklen;
      unsigned long i;

      blocklen = buflen % 5552;
      while (buflen) {
         for (i=0; i + 7 < blocklen; i += 8) {
            s1 += buffer[0], s2 += s1;
            s1 += buffer[1], s2 += s1;
            s1 += buffer[2], s2 += s1;
            s1 += buffer[3], s2 += s1;
            s1 += buffer[4], s2 += s1;
            s1 += buffer[5], s2 += s1;
            s1 += buffer[6], s2 += s1;
            s1 += buffer[7], s2 += s1;

            buffer += 8;
         }

         for (; i < blocklen; ++i)
            s1 += *buffer++, s2 += s1;

         s1 %= ADLER_MOD, s2 %= ADLER_MOD;
         buflen -= blocklen;
         blocklen = 5552;
      }
      return (s2 << 16) + s1;
   }